

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void ps_parser_to_token_array
               (PS_Parser parser,T1_Token tokens,FT_UInt max_tokens,FT_Int *pnum_tokens)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  T1_Token pTVar3;
  T1_TokenRec token;
  T1_TokenRec master;
  T1_TokenRec_ local_60;
  T1_TokenRec_ local_48;
  
  *pnum_tokens = -1;
  ps_parser_to_token(parser,&local_48);
  if (local_48.type == T1_TOKEN_TYPE_ARRAY) {
    pFVar1 = parser->cursor;
    pFVar2 = parser->limit;
    parser->cursor = local_48.start + 1;
    parser->limit = local_48.limit + -1;
    pTVar3 = tokens;
    do {
      if (parser->limit <= parser->cursor) break;
      ps_parser_to_token(parser,&local_60);
      if (local_60.type != T1_TOKEN_TYPE_NONE) {
        if (pTVar3 < tokens + max_tokens && tokens != (T1_Token)0x0) {
          *(ulong *)&pTVar3->type = CONCAT44(local_60._20_4_,local_60.type);
          pTVar3->start = local_60.start;
          pTVar3->limit = local_60.limit;
        }
        pTVar3 = pTVar3 + 1;
      }
    } while (local_60.type != T1_TOKEN_TYPE_NONE);
    *pnum_tokens = (int)((ulong)((long)pTVar3 - (long)tokens) >> 3) * -0x55555555;
    parser->cursor = pFVar1;
    parser->limit = pFVar2;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_to_token_array( PS_Parser  parser,
                            T1_Token   tokens,
                            FT_UInt    max_tokens,
                            FT_Int*    pnum_tokens )
  {
    T1_TokenRec  master;


    *pnum_tokens = -1;

    /* this also handles leading whitespace */
    ps_parser_to_token( parser, &master );

    if ( master.type == T1_TOKEN_TYPE_ARRAY )
    {
      FT_Byte*  old_cursor = parser->cursor;
      FT_Byte*  old_limit  = parser->limit;
      T1_Token  cur        = tokens;
      T1_Token  limit      = cur + max_tokens;


      /* don't include outermost delimiters */
      parser->cursor = master.start + 1;
      parser->limit  = master.limit - 1;

      while ( parser->cursor < parser->limit )
      {
        T1_TokenRec  token;


        ps_parser_to_token( parser, &token );
        if ( !token.type )
          break;

        if ( tokens && cur < limit )
          *cur = token;

        cur++;
      }

      *pnum_tokens = (FT_Int)( cur - tokens );

      parser->cursor = old_cursor;
      parser->limit  = old_limit;
    }
  }